

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

ReferenceCounterValueType __thiscall
Diligent::RenderDeviceBase<Diligent::SerializationEngineImplTraits>::Release
          (RenderDeviceBase<Diligent::SerializationEngineImplTraits> *this)

{
  ReferenceCounterValueType RVar1;
  RenderDeviceBase<Diligent::SerializationEngineImplTraits> *this_local;
  
  RVar1 = RefCountedObject<Diligent::ISerializationDevice>::Release
                    ((RefCountedObject<Diligent::ISerializationDevice> *)this);
  return RVar1;
}

Assistant:

Release() override final
    {
        return TObjectBase::Release();
    }